

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void charevnt_hero_release(tgestate_t *state,route_t *route)

{
  route->index = 0xa4;
  route->step = '\x03';
  state->automatic_player_counter = '\0';
  set_hero_route_force(state,&charevnt_hero_release::route_37);
  return;
}

Assistant:

void charevnt_hero_release(tgestate_t *state, route_t *route)
{
  /* Reverse the commandant's route. */
  route->index = routeindex_36_GO_TO_SOLITARY | ROUTEINDEX_REVERSE_FLAG;
  route->step  = 3;

  state->automatic_player_counter = 0; /* Force automatic control */

  {
    static const route_t route_37 = { routeindex_37_HERO_LEAVE_SOLITARY, 0 }; /* was BC */
    set_hero_route_force(state, &route_37);
  }
}